

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall Math_TwoSum_Test::~Math_TwoSum_Test(Math_TwoSum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Math, TwoSum) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a = r(), b = r();
        CompensatedFloat tp = TwoSum(a, b);
        EXPECT_EQ((Float)tp, a + b);
        EXPECT_EQ((double)tp, (double)a + (double)b);
    }
}